

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void * luaM_realloc_(lua_State *L,void *block,size_t osize,size_t nsize)

{
  global_State *pgVar1;
  void *pvVar2;
  global_State *g;
  size_t nsize_local;
  size_t osize_local;
  void *block_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  pvVar2 = (*pgVar1->frealloc)(pgVar1->ud,block,osize,nsize);
  if ((pvVar2 == (void *)0x0) && (nsize != 0)) {
    luaD_throw(L,4);
  }
  pgVar1->totalbytes = (pgVar1->totalbytes - osize) + nsize;
  return pvVar2;
}

Assistant:

static void*luaM_realloc_(lua_State*L,void*block,size_t osize,size_t nsize){
global_State*g=G(L);
block=(*g->frealloc)(g->ud,block,osize,nsize);
if(block==NULL&&nsize>0)
luaD_throw(L,4);
g->totalbytes=(g->totalbytes-osize)+nsize;
return block;
}